

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O3

void Ptex::v2_2::ConvertFromFloat(void *dst,float *src,DataType dt,int numChannels)

{
  uint16_t uVar1;
  ulong uVar2;
  float fVar3;
  
  switch(dt) {
  case dt_uint8:
    if (0 < numChannels) {
      uVar2 = 0;
      do {
        fVar3 = src[uVar2];
        if (fVar3 <= 0.0) {
          fVar3 = 0.0;
        }
        if (1.0 <= fVar3) {
          fVar3 = 1.0;
        }
        *(char *)((long)dst + uVar2) = (char)(int)(fVar3 * 255.0 + 0.5);
        uVar2 = uVar2 + 1;
      } while ((uint)numChannels != uVar2);
    }
    break;
  case dt_uint16:
    if (0 < numChannels) {
      uVar2 = 0;
      do {
        fVar3 = src[uVar2];
        if (fVar3 <= 0.0) {
          fVar3 = 0.0;
        }
        if (1.0 <= fVar3) {
          fVar3 = 1.0;
        }
        *(short *)((long)dst + uVar2 * 2) = (short)(int)(fVar3 * 65535.0 + 0.5);
        uVar2 = uVar2 + 1;
      } while ((uint)numChannels != uVar2);
    }
    break;
  case dt_half:
    if (0 < numChannels) {
      uVar2 = 0;
      do {
        uVar1 = PtexHalf::fromFloat(src[uVar2] + 0.0);
        *(uint16_t *)((long)dst + uVar2 * 2) = uVar1;
        uVar2 = uVar2 + 1;
      } while ((uint)numChannels != uVar2);
    }
    break;
  case dt_float:
    memcpy(dst,src,(long)numChannels << 2);
    return;
  }
  return;
}

Assistant:

void ConvertFromFloat(void* dst, const float* src, DataType dt, int numChannels)
{
    switch (dt) {
    case dt_uint8:  ConvertArrayClamped(static_cast<uint8_t*>(dst),  src, numChannels, 255.0, 0.5); break;
    case dt_uint16: ConvertArrayClamped(static_cast<uint16_t*>(dst), src, numChannels, 65535.0, 0.5); break;
    case dt_half:   ConvertArray(static_cast<PtexHalf*>(dst), src, numChannels, 1.0); break;
    case dt_float:  memcpy(dst, src, sizeof(float)*numChannels); break;
    }
}